

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

int read_nal_unit(h264_stream_t *h,uint8_t *buf,int size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  uint32_t uVar4;
  uint8_t *rbsp_buf_00;
  bs_t *b_00;
  bs_t *b;
  int rc;
  uint8_t *rbsp_buf;
  int rbsp_size;
  int nal_size;
  nal_t *nal;
  uint8_t *puStack_20;
  int size_local;
  uint8_t *buf_local;
  h264_stream_t *h_local;
  
  _rbsp_size = h->nal;
  rbsp_buf._0_4_ = size;
  rbsp_buf._4_4_ = size;
  nal._4_4_ = size;
  puStack_20 = buf;
  buf_local = (uint8_t *)h;
  rbsp_buf_00 = (uint8_t *)calloc(1,(long)size);
  iVar3 = nal_to_rbsp(puStack_20,(int *)((long)&rbsp_buf + 4),rbsp_buf_00,(int *)&rbsp_buf);
  if (iVar3 < 0) {
    free(rbsp_buf_00);
    h_local._4_4_ = -1;
  }
  else {
    b_00 = bs_new(rbsp_buf_00,(long)(int)rbsp_buf);
    bs_skip_u(b_00,1);
    uVar4 = bs_read_u(b_00,2);
    _rbsp_size->nal_ref_idc = uVar4;
    uVar4 = bs_read_u(b_00,5);
    _rbsp_size->nal_unit_type = uVar4;
    if (((_rbsp_size->nal_unit_type == 0xe) || (_rbsp_size->nal_unit_type == 0x15)) ||
       (_rbsp_size->nal_unit_type == 0x14)) {
      if (_rbsp_size->nal_unit_type == 0x15) {
        uVar4 = bs_read_u1(b_00);
        _rbsp_size->avc_3d_extension_flag = uVar4 != 0;
      }
      else {
        uVar4 = bs_read_u1(b_00);
        _rbsp_size->svc_extension_flag = uVar4 != 0;
      }
      if ((_rbsp_size->svc_extension_flag & 1U) != 0) {
        read_nal_unit_header_svc_extension(_rbsp_size->nal_svc_ext,b_00);
      }
    }
    switch(_rbsp_size->nal_unit_type) {
    case 0:
    case 2:
    case 3:
    case 4:
    case 0xc:
    case 0xd:
    default:
      bs_free(b_00);
      free(rbsp_buf_00);
      return -1;
    case 1:
    case 5:
    case 0x13:
      read_slice_layer_rbsp((h264_stream_t *)buf_local,b_00);
      break;
    case 7:
      read_seq_parameter_set_rbsp(*(sps_t **)(buf_local + 8),b_00);
      read_rbsp_trailing_bits(b_00);
      memcpy(*(void **)(buf_local + (long)*(int *)(*(long *)(buf_local + 8) + 0x24) * 8 + 0x50),
             *(void **)(buf_local + 8),0x1028);
      break;
    case 8:
      read_pic_parameter_set_rbsp((h264_stream_t *)buf_local,b_00);
      read_rbsp_trailing_bits(b_00);
      break;
    case 9:
      read_access_unit_delimiter_rbsp((h264_stream_t *)buf_local,b_00);
      read_rbsp_trailing_bits(b_00);
      break;
    case 10:
      read_end_of_seq_rbsp((h264_stream_t *)buf_local,b_00);
      read_rbsp_trailing_bits(b_00);
      break;
    case 0xb:
      read_end_of_stream_rbsp((h264_stream_t *)buf_local,b_00);
      read_rbsp_trailing_bits(b_00);
      break;
    case 0xe:
      read_prefix_nal_unit_rbsp(*(nal_t **)buf_local,b_00);
      read_rbsp_trailing_bits(b_00);
      break;
    case 0xf:
      read_subset_seq_parameter_set_rbsp(*(sps_subset_t **)(buf_local + 0x10),b_00);
      read_rbsp_trailing_bits(b_00);
      puVar1 = *(undefined8 **)
                (buf_local + (long)*(int *)(**(long **)(buf_local + 0x10) + 0x24) * 8 + 0x150);
      puVar2 = *(undefined8 **)(buf_local + 0x10);
      *puVar1 = *puVar2;
      puVar1[1] = puVar2[1];
      puVar1[2] = puVar2[2];
      break;
    case 0x14:
      read_slice_layer_rbsp((h264_stream_t *)buf_local,b_00);
    }
    iVar3 = bs_overrun(b_00);
    if (iVar3 == 0) {
      bs_free(b_00);
      free(rbsp_buf_00);
      h_local._4_4_ = rbsp_buf._4_4_;
    }
    else {
      bs_free(b_00);
      free(rbsp_buf_00);
      h_local._4_4_ = -1;
    }
  }
  return h_local._4_4_;
}

Assistant:

int read_nal_unit(h264_stream_t* h, uint8_t* buf, int size)
{
    nal_t* nal = h->nal;

    int nal_size = size;
    int rbsp_size = size;
    uint8_t* rbsp_buf = (uint8_t*)calloc(1, rbsp_size);

    if( 1 )
    {
        int rc = nal_to_rbsp(buf, &nal_size, rbsp_buf, &rbsp_size);

        if (rc < 0) { free(rbsp_buf); return -1; } // handle conversion error
    }

    if( 0 )
    {
        rbsp_size = size*3/4; // NOTE this may have to be slightly smaller (3/4 smaller, worst case) in order to be guaranteed to fit
    }

    bs_t* b = bs_new(rbsp_buf, rbsp_size);
    /* forbidden_zero_bit */ bs_skip_u(b, 1);
    nal->nal_ref_idc = bs_read_u(b, 2);
    nal->nal_unit_type = bs_read_u(b, 5);
    
    if( nal->nal_unit_type == 14 || nal->nal_unit_type == 21 || nal->nal_unit_type == 20 )
    {
        if( nal->nal_unit_type != 21 )
        {
            nal->svc_extension_flag = bs_read_u1(b);
        }
        else
        {
            nal->avc_3d_extension_flag = bs_read_u1(b);
        }
        
        if( nal->svc_extension_flag )
        {
            read_nal_unit_header_svc_extension(nal->nal_svc_ext, b);
        }
    }

    switch ( nal->nal_unit_type )
    {
        case NAL_UNIT_TYPE_CODED_SLICE_IDR:
        case NAL_UNIT_TYPE_CODED_SLICE_NON_IDR:  
        case NAL_UNIT_TYPE_CODED_SLICE_AUX:
            read_slice_layer_rbsp(h, b);
            break;

#ifdef HAVE_SEI
        case NAL_UNIT_TYPE_SEI:
            read_sei_rbsp(h, b);
            read_rbsp_trailing_bits(b);
            break;
#endif

        case NAL_UNIT_TYPE_SPS: 
            read_seq_parameter_set_rbsp(h->sps, b);
            read_rbsp_trailing_bits(b);
            
            if( 1 )
            {
                memcpy(h->sps_table[h->sps->seq_parameter_set_id], h->sps, sizeof(sps_t));
            }

            break;

        case NAL_UNIT_TYPE_PPS:   
            read_pic_parameter_set_rbsp(h, b);
            read_rbsp_trailing_bits(b);
            break;

        case NAL_UNIT_TYPE_AUD:     
            read_access_unit_delimiter_rbsp(h, b); 
            read_rbsp_trailing_bits(b);
            break;

        case NAL_UNIT_TYPE_END_OF_SEQUENCE: 
            read_end_of_seq_rbsp(h, b);
            read_rbsp_trailing_bits(b);
            break;

        case NAL_UNIT_TYPE_END_OF_STREAM: 
            read_end_of_stream_rbsp(h, b);
            read_rbsp_trailing_bits(b);
            break;

        //SVC support
        case NAL_UNIT_TYPE_SUBSET_SPS:
            read_subset_seq_parameter_set_rbsp(h->sps_subset, b);
            read_rbsp_trailing_bits(b);
            
            if( 1 )
            {
                memcpy(h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id], h->sps_subset, sizeof(sps_subset_t));
                //memcpy(h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id]->sps, h->sps_subset->sps, sizeof(sps_t));
                //memcpy(h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id]->sps_svc_ext, h->sps_subset->sps_svc_ext, sizeof(sps_svc_ext_t));
                //h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id]->additional_extension2_flag = h->sps_subset->additional_extension2_flag;
            }

            break;
            
        //prefix NAL
        case NAL_UNIT_TYPE_PREFIX_NAL:
            read_prefix_nal_unit_rbsp(h->nal, b);
            read_rbsp_trailing_bits(b);
            break;
            
        //SVC support
        case NAL_UNIT_TYPE_CODED_SLICE_SVC_EXTENSION:            
            read_slice_layer_rbsp(h, b);
            
            break;
            
        case NAL_UNIT_TYPE_FILLER:
        case NAL_UNIT_TYPE_SPS_EXT:
        case NAL_UNIT_TYPE_UNSPECIFIED:
        case NAL_UNIT_TYPE_CODED_SLICE_DATA_PARTITION_A:  
        case NAL_UNIT_TYPE_CODED_SLICE_DATA_PARTITION_B: 
        case NAL_UNIT_TYPE_CODED_SLICE_DATA_PARTITION_C:
        default:
            bs_free(b);
            free(rbsp_buf);
            return -1;
    }

    if (bs_overrun(b)) { bs_free(b); free(rbsp_buf); return -1; }

    if( 0 )
    {
        // now get the actual size used
        rbsp_size = bs_pos(b);

        int rc = rbsp_to_nal(rbsp_buf, &rbsp_size, buf, &nal_size);
        if (rc < 0) { bs_free(b); free(rbsp_buf); return -1; }
    }

    bs_free(b);
    free(rbsp_buf);

    return nal_size;
}